

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdtls.cpp
# Opt level: O2

void QDtls::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QDtls::*)(QSslPreSharedKeyAuthenticator*)>
                      ((QtMocHelpers *)_a,(void **)pskRequired,0,0);
    if (!bVar1) {
      QtMocHelpers::indexOfMethod<void(QDtls::*)()>
                ((QtMocHelpers *)_a,(void **)handshakeTimeout,0,1);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      handshakeTimeout((QDtls *)_o);
      return;
    }
    if (_id == 0) {
      pskRequired((QDtls *)_o,*_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QDtls::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDtls *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pskRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 1: _t->handshakeTimeout(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDtls::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QDtls::pskRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDtls::*)()>(_a, &QDtls::handshakeTimeout, 1))
            return;
    }
}